

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

Gia_Man_t *
Bmc_GiaGenerateGiaOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  char *__s;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Vec_Bit_t *pVVar7;
  int *__s_00;
  Gia_Man_t *p_00;
  char *__dest;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  uint uVar14;
  Vec_Bit_t *vJustis;
  Vec_Bit_t *vValues;
  int local_60;
  Vec_Bit_t *local_40;
  Vec_Bit_t *local_38;
  
  Bmc_GiaGenerateJust(p,pCex,&local_38,&local_40);
  uVar10 = p->nRegs;
  iVar11 = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
  pVVar7 = (Vec_Bit_t *)malloc(0x10);
  iVar13 = iVar11 * 0x20;
  pVVar7->nCap = iVar13;
  if (iVar11 == 0) {
    sVar12 = 0;
    __s_00 = (int *)0x0;
  }
  else {
    sVar12 = (long)iVar11 << 2;
    __s_00 = (int *)malloc(sVar12);
  }
  pVVar7->pArray = __s_00;
  pVVar7->nSize = iVar13;
  uVar14 = 0;
  memset(__s_00,0,sVar12);
  *pvInits = pVVar7;
  if (0 < (int)uVar10) {
    pVVar2 = p->vCis;
    do {
      iVar11 = pVVar2->nSize;
      uVar9 = (uVar14 - uVar10) + iVar11;
      if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) goto LAB_0057d6c2;
      iVar11 = pVVar2->pArray[uVar9];
      if ((iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0057d6a3;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar9 = p->nObjs * iFrBeg + iVar11;
      if (((int)uVar9 < 0) || (local_38->nSize <= (int)uVar9)) goto LAB_0057d684;
      if (((uint)local_38->pArray[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) {
        if (iVar13 <= (int)uVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        __s_00[uVar14 >> 5] = __s_00[uVar14 >> 5] | 1 << ((byte)uVar14 & 0x1f);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar10);
  }
  p_00 = Gia_ManStart(uVar10 * 2 + 2);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar12 = strlen(__s);
    __dest = (char *)malloc(sVar12 + 1);
    strcpy(__dest,__s);
  }
  pVVar7 = local_40;
  p_00->pName = __dest;
  iVar11 = p->nRegs;
  if (iVar11 < 1) {
    local_60 = 1;
  }
  else {
    iVar13 = 0;
    local_60 = 1;
    do {
      iVar1 = p->vCis->nSize;
      uVar10 = (iVar1 - iVar11) + iVar13;
      if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
LAB_0057d6c2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = p->vCis->pArray[uVar10];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_0057d6a3:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar8 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar8)) {
LAB_0057d665:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar8 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar8)) goto LAB_0057d665;
      pGVar3 = pGVar3 + iVar11;
      pGVar6 = p->pObjs;
      if ((pGVar3 < pGVar6) || (pGVar6 + p->nObjs <= pGVar3)) goto LAB_0057d665;
      uVar10 = (int)((ulong)((long)pGVar3 - (long)pGVar6) >> 2) * -0x55555555 + p->nObjs * iFrEnd;
      if (((int)uVar10 < 0) || (pVVar7->nSize <= (int)uVar10)) goto LAB_0057d684;
      if (((uint)pVVar7->pArray[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0) {
        if (local_38->nSize <= (int)uVar10) {
LAB_0057d684:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar14 = (int)((ulong)((long)pGVar8 - (long)pGVar5) >> 2) * 0x55555556;
        if ((local_38->pArray[uVar10 >> 5] & 1 << ((byte)uVar10 & 0x1f)) == 0) {
          if ((int)uVar14 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar14 = uVar14 | 1;
        }
        local_60 = Gia_ManAppendAnd(p_00,local_60,uVar14);
      }
      iVar13 = iVar13 + 1;
      iVar11 = p->nRegs;
    } while (iVar13 < iVar11);
  }
  Gia_ManAppendCo(p_00,local_60);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
  }
  free(local_40);
  return p_00;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vValues;
    Vec_Bit_t * vJustis;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int k, Cube = 1, Counter = 0;
    Bmc_GiaGenerateJust( p, pCex, &vValues, &vJustis );
    // collect flop values in frame iFrBeg
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, k )
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrBeg + Gia_ObjId(p, pObj)) )
            Vec_BitWriteEntry( *pvInits, k, 1 );
    // create GIA with justified values in iFrEnd
    pNew = Gia_ManStart( 2 * Gia_ManRegNum(p) + 2 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObj, k )
    {
        int Literal = Gia_ManAppendCi(pNew);
        if ( !Vec_BitEntry(vJustis, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            continue;
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            Cube = Gia_ManAppendAnd( pNew, Cube, Literal );
        else
            Cube = Gia_ManAppendAnd( pNew, Cube, Abc_LitNot(Literal) );
        Counter++;
    }
//    printf( "Only %d flops (out of %d) belong to the care set.\n", Counter, Gia_ManRegNum(p) );
    Gia_ManAppendCo( pNew, Cube );
    Vec_BitFree( vValues );
    Vec_BitFree( vJustis );
    return pNew;
}